

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jsoncpp.cpp
# Opt level: O1

bool __thiscall Json::OurReader::decodeNumber(OurReader *this,Token *token,Value *decoded)

{
  char cVar1;
  byte bVar2;
  ushort uVar3;
  ValueHolder VVar4;
  bool bVar5;
  bool bVar6;
  ushort uVar7;
  ulong uVar8;
  byte *pbVar9;
  ulong uVar10;
  ushort uVar11;
  ValueHolder *this_00;
  ulong uVar12;
  ulong uVar13;
  ValueHolder local_a8;
  undefined4 local_a0;
  undefined8 local_98;
  undefined8 uStack_90;
  undefined8 local_88;
  ValueHolder local_80 [5];
  ValueHolder local_58;
  ushort local_50;
  
  cVar1 = *token->start_;
  uVar12 = -(ulong)(cVar1 != '-') | 0x8000000000000000;
  pbVar9 = (byte *)(token->start_ + (cVar1 == '-'));
  uVar13 = uVar12 / 10;
  bVar6 = false;
  uVar10 = 0;
  while( true ) {
    if (token->end_ <= pbVar9) break;
    bVar2 = *pbVar9;
    pbVar9 = pbVar9 + 1;
    if (((byte)(bVar2 - 0x3a) < 0xf6) ||
       ((uVar8 = (ulong)(bVar2 - 0x30), uVar13 <= uVar10 &&
        (((uVar13 < uVar10 || (pbVar9 != (byte *)token->end_)) || (uVar12 % 10 < uVar8)))))) {
      bVar6 = decodeDouble(this,token,decoded);
      bVar5 = false;
    }
    else {
      uVar10 = uVar8 + uVar10 * 10;
      bVar5 = true;
    }
    if (!bVar5) {
      return bVar6;
    }
  }
  if (cVar1 == '-') {
    this_00 = &local_58;
    uVar10 = -uVar10;
  }
  else {
    if (0x7fffffff < uVar10) {
      this_00 = &local_a8;
      local_98 = 0;
      uStack_90 = 0;
      local_88 = 0;
      uVar3 = *(ushort *)&decoded->field_0x8;
      *(ushort *)&decoded->field_0x8 = uVar3 & 0xff00 | 2;
      uVar7 = uVar3 & 0xff | (ushort)local_a0 & 0xfe00;
      local_a0 = CONCAT22((short)((uint)local_a0 >> 0x10),uVar7);
      local_a8 = decoded->value_;
      (decoded->value_).uint_ = uVar10;
      uVar11 = uVar3 & 0xfe00 | 2;
      goto LAB_00108d98;
    }
    this_00 = local_80;
    local_50 = (ushort)local_80[1]._0_4_;
  }
  *(ushort *)(this_00 + 1) = (local_50 & 0xfe00) + 1;
  this_00[2].int_ = 0;
  this_00[3].int_ = 0;
  this_00[4].int_ = 0;
  this_00->int_ = uVar10;
  uVar3 = *(ushort *)&decoded->field_0x8;
  uVar11 = (uVar3 & 0xff00) + 1;
  *(ushort *)&decoded->field_0x8 = uVar11;
  uVar7 = uVar3 & 0xff | local_50 & 0xfe00;
  *(ushort *)(this_00 + 1) = uVar7;
  VVar4 = decoded->value_;
  (decoded->value_).int_ = uVar10;
  *this_00 = VVar4;
  uVar11 = uVar11 & 0xfe01;
LAB_00108d98:
  *(ushort *)&decoded->field_0x8 = uVar11;
  *(ushort *)(this_00 + 1) = uVar7 | uVar3 & 0x100;
  VVar4 = (ValueHolder)decoded->comments_;
  decoded->comments_ = (CommentInfo *)this_00[2];
  this_00[2] = VVar4;
  VVar4 = (ValueHolder)decoded->start_;
  decoded->start_ = (ptrdiff_t)this_00[3];
  this_00[3] = VVar4;
  VVar4 = (ValueHolder)decoded->limit_;
  decoded->limit_ = (ptrdiff_t)this_00[4];
  this_00[4] = VVar4;
  Value::~Value((Value *)this_00);
  return true;
}

Assistant:

bool OurReader::decodeNumber(Token& token, Value& decoded) {
  // Attempts to parse the number as an integer. If the number is
  // larger than the maximum supported value of an integer then
  // we decode the number as a double.
  Location current = token.start_;
  bool isNegative = *current == '-';
  if (isNegative)
    ++current;
  // TODO: Help the compiler do the div and mod at compile time or get rid of them.
  Value::LargestUInt maxIntegerValue =
      isNegative ? Value::LargestUInt(-Value::minLargestInt)
                 : Value::maxLargestUInt;
  Value::LargestUInt threshold = maxIntegerValue / 10;
  Value::LargestUInt value = 0;
  while (current < token.end_) {
    Char c = *current++;
    if (c < '0' || c > '9')
      return decodeDouble(token, decoded);
    Value::UInt digit(static_cast<Value::UInt>(c - '0'));
    if (value >= threshold) {
      // We've hit or exceeded the max value divided by 10 (rounded down). If
      // a) we've only just touched the limit, b) this is the last digit, and
      // c) it's small enough to fit in that rounding delta, we're okay.
      // Otherwise treat this number as a double to avoid overflow.
      if (value > threshold || current != token.end_ ||
          digit > maxIntegerValue % 10) {
        return decodeDouble(token, decoded);
      }
    }
    value = value * 10 + digit;
  }
  if (isNegative)
    decoded = -Value::LargestInt(value);
  else if (value <= Value::LargestUInt(Value::maxInt))
    decoded = Value::LargestInt(value);
  else
    decoded = value;
  return true;
}